

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  bool bVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Primitive *prim;
  ulong uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  Ray *local_1300;
  ulong local_12f8;
  ulong *local_12f0;
  RayQueryContext *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  uint uVar25;
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_12f0 = local_11d0;
      aVar2 = (ray->dir).field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx((undefined1  [16])aVar2,auVar23);
      auVar27._8_4_ = 0x219392ef;
      auVar27._0_8_ = 0x219392ef219392ef;
      auVar27._12_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar23,auVar27,1);
      auVar23 = vblendvps_avx((undefined1  [16])aVar2,auVar27,auVar23);
      auVar27 = vrcpps_avx(auVar23);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar23 = vfnmadd231ps_fma(auVar28,auVar27,auVar23);
      auVar7 = vfmadd132ps_fma(auVar23,auVar27,auVar27);
      fVar26 = auVar7._0_4_;
      local_11f8._4_4_ = fVar26;
      local_11f8._0_4_ = fVar26;
      local_11f8._8_4_ = fVar26;
      local_11f8._12_4_ = fVar26;
      local_11f8._16_4_ = fVar26;
      local_11f8._20_4_ = fVar26;
      local_11f8._24_4_ = fVar26;
      local_11f8._28_4_ = fVar26;
      auVar33 = ZEXT3264(local_11f8);
      auVar23 = vmovshdup_avx(auVar7);
      uVar21 = auVar23._0_8_;
      local_1218._8_8_ = uVar21;
      local_1218._0_8_ = uVar21;
      local_1218._16_8_ = uVar21;
      local_1218._24_8_ = uVar21;
      auVar34 = ZEXT3264(local_1218);
      auVar28 = vshufpd_avx(auVar7,auVar7,1);
      auVar27 = vshufps_avx(auVar7,auVar7,0xaa);
      uVar21 = auVar27._0_8_;
      local_1238._8_8_ = uVar21;
      local_1238._0_8_ = uVar21;
      local_1238._16_8_ = uVar21;
      local_1238._24_8_ = uVar21;
      auVar35 = ZEXT3264(local_1238);
      auVar29._0_4_ = fVar26 * (ray->org).field_0.m128[0];
      auVar29._4_4_ = auVar7._4_4_ * (ray->org).field_0.m128[1];
      auVar29._8_4_ = auVar7._8_4_ * (ray->org).field_0.m128[2];
      auVar29._12_4_ = auVar7._12_4_ * (ray->org).field_0.m128[3];
      auVar27 = vmovshdup_avx(auVar29);
      auVar7 = vshufps_avx(auVar29,auVar29,0xaa);
      local_12f8 = (ulong)(fVar26 < 0.0) << 5;
      uVar16 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      uVar19 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
      uVar17 = local_12f8 ^ 0x20;
      uVar18 = CONCAT44(auVar29._0_4_,auVar29._0_4_);
      local_1258._0_8_ = uVar18 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar29._0_4_;
      local_1258._12_4_ = -auVar29._0_4_;
      local_1258._16_4_ = -auVar29._0_4_;
      local_1258._20_4_ = -auVar29._0_4_;
      local_1258._24_4_ = -auVar29._0_4_;
      local_1258._28_4_ = -auVar29._0_4_;
      auVar22 = ZEXT3264(local_1258);
      uVar12 = auVar27._0_4_;
      uVar25 = auVar27._4_4_;
      local_1278._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar12 ^ 0x80000000;
      local_1278._12_4_ = uVar25 ^ 0x80000000;
      local_1278._16_4_ = uVar12 ^ 0x80000000;
      local_1278._20_4_ = uVar25 ^ 0x80000000;
      local_1278._24_4_ = uVar12 ^ 0x80000000;
      local_1278._28_4_ = uVar25 ^ 0x80000000;
      auVar24 = ZEXT3264(local_1278);
      uVar12 = auVar7._0_4_;
      uVar25 = auVar7._4_4_;
      local_1298._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar12 ^ 0x80000000;
      local_1298._12_4_ = uVar25 ^ 0x80000000;
      local_1298._16_4_ = uVar12 ^ 0x80000000;
      local_1298._20_4_ = uVar25 ^ 0x80000000;
      local_1298._24_4_ = uVar12 ^ 0x80000000;
      local_1298._28_4_ = uVar25 ^ 0x80000000;
      auVar30 = ZEXT3264(local_1298);
      uVar20 = auVar3._0_4_;
      local_12b8._4_4_ = uVar20;
      local_12b8._0_4_ = uVar20;
      local_12b8._8_4_ = uVar20;
      local_12b8._12_4_ = uVar20;
      local_12b8._16_4_ = uVar20;
      local_12b8._20_4_ = uVar20;
      local_12b8._24_4_ = uVar20;
      local_12b8._28_4_ = uVar20;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar1;
      local_12d8._0_4_ = fVar1;
      local_12d8._8_4_ = fVar1;
      local_12d8._12_4_ = fVar1;
      local_12d8._16_4_ = fVar1;
      local_12d8._20_4_ = fVar1;
      local_12d8._24_4_ = fVar1;
      local_12d8._28_4_ = fVar1;
      auVar32 = ZEXT3264(local_12d8);
      uVar18 = local_12f8;
      local_1300 = ray;
      local_12e8 = context;
LAB_004d5f27:
      do {
        uVar14 = local_12f0[-1];
        local_12f0 = local_12f0 + -1;
        while ((uVar14 & 8) == 0) {
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar18),auVar22._0_32_,
                                    auVar33._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar16),auVar24._0_32_,
                                   auVar34._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar3));
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar19),auVar30._0_32_,
                                    auVar35._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar23),auVar31._0_32_);
          auVar4 = vpmaxsd_avx2(auVar4,auVar5);
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar17),auVar22._0_32_,
                                    auVar33._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + (uVar16 ^ 0x20)),
                                   auVar24._0_32_,auVar34._0_32_);
          auVar5 = vpminsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar3));
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + (uVar19 ^ 0x20)),
                                    auVar30._0_32_,auVar35._0_32_);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar23),auVar32._0_32_);
          auVar5 = vpminsd_avx2(auVar5,auVar6);
          auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
          iVar11 = vmovmskps_avx(auVar4);
          if (iVar11 == 0xff) {
            if (local_12f0 == &local_11d8) {
              return;
            }
            goto LAB_004d5f27;
          }
          bVar10 = ~(byte)iVar11;
          uVar9 = uVar14 & 0xfffffffffffffff0;
          lVar15 = 0;
          for (uVar14 = (ulong)bVar10; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
          {
            lVar15 = lVar15 + 1;
          }
          uVar14 = *(ulong *)(uVar9 + lVar15 * 8);
          uVar12 = bVar10 - 1 & (uint)bVar10;
          uVar13 = (ulong)uVar12;
          if (uVar12 != 0) {
            *local_12f0 = uVar14;
            lVar15 = 0;
            for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar12 = uVar12 - 1 & uVar12;
            uVar13 = (ulong)uVar12;
            bVar8 = uVar12 == 0;
            while( true ) {
              local_12f0 = local_12f0 + 1;
              uVar14 = *(ulong *)(uVar9 + lVar15 * 8);
              if (bVar8) break;
              *local_12f0 = uVar14;
              lVar15 = 0;
              for (uVar14 = uVar13; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar13 = uVar13 - 1 & uVar13;
              bVar8 = uVar13 == 0;
            }
          }
        }
        local_12e0 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_12e0 != 0) {
          prim = (Primitive *)(uVar14 & 0xfffffffffffffff0);
          do {
            bVar8 = InstanceArrayIntersector1::occluded(&local_1301,ray,local_12e8,prim);
            if (bVar8) {
              local_1300->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_12e0 = local_12e0 + -1;
            ray = local_1300;
          } while (local_12e0 != 0);
        }
        auVar33 = ZEXT3264(local_11f8);
        auVar34 = ZEXT3264(local_1218);
        auVar35 = ZEXT3264(local_1238);
        auVar22 = ZEXT3264(local_1258);
        auVar24 = ZEXT3264(local_1278);
        auVar30 = ZEXT3264(local_1298);
        auVar31 = ZEXT3264(local_12b8);
        auVar32 = ZEXT3264(local_12d8);
        uVar18 = local_12f8;
      } while (local_12f0 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }